

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByParentEq::operator()
          (void *this,Symbol *a,Symbol *b)

{
  bool bVar1;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_50;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_38;
  Symbol *local_20;
  Symbol *b_local;
  Symbol *a_local;
  SymbolByParentEq *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (Symbol *)this;
  Symbol::parent_name_key(&local_38,a);
  Symbol::parent_name_key(&local_50,local_20);
  bVar1 = std::operator==(&local_38,&local_50);
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.parent_name_key() == b.parent_name_key();
  }